

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O3

bool __thiscall glslang::TTypeParameters::operator==(TTypeParameters *this,TTypeParameters *rhs)

{
  bool bVar1;
  
  if (this->basicType == rhs->basicType) {
    bVar1 = TSmallArrayVector::operator==(&this->arraySizes->sizes,&rhs->arraySizes->sizes);
    if ((bVar1) && (this->basicType == EbtSpirvType)) {
      if ((this->spirvType != (TSpirvType *)0x0) && (rhs->spirvType != (TSpirvType *)0x0)) {
        bVar1 = TSpirvType::operator==(this->spirvType,rhs->spirvType);
        return bVar1;
      }
      __assert_fail("spirvType && rhs.spirvType",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x59c,
                    "bool glslang::TTypeParameters::operator==(const TTypeParameters &) const");
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool operator==(const TTypeParameters& rhs) const
    {
        bool same = basicType == rhs.basicType && *arraySizes == *rhs.arraySizes;
        if (same && basicType == EbtSpirvType) {
            assert(spirvType && rhs.spirvType);
            return *spirvType == *rhs.spirvType;
        }
        return same;
    }